

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.hpp
# Opt level: O1

void __thiscall sf2cute::SFPresetZone::SFPresetZone(SFPresetZone *this,SFPresetZone *origin)

{
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFZone_0011e7d8;
  (this->super_SFZone).generators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (origin->super_SFZone).generators_.
       super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_SFZone).generators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (origin->super_SFZone).generators_.
       super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_SFZone).generators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (origin->super_SFZone).generators_.
       super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (origin->super_SFZone).generators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (origin->super_SFZone).generators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (origin->super_SFZone).generators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SFZone).modulators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (origin->super_SFZone).modulators_.
       super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_SFZone).modulators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (origin->super_SFZone).modulators_.
       super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_SFZone).modulators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (origin->super_SFZone).modulators_.
       super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (origin->super_SFZone).modulators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (origin->super_SFZone).modulators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (origin->super_SFZone).modulators_.
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFPresetZone_0011e7f8;
  (this->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (origin->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (origin->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (origin->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (origin->instrument_).super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->parent_preset_ = origin->parent_preset_;
  return;
}

Assistant:

SFZone(SFZone && origin) = default;